

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

_Bool get_token(HttpProxyNegotiator *s)

{
  byte bVar1;
  ulong uVar2;
  _Bool _Var3;
  strbuf *psVar4;
  ulong uVar5;
  ulong uVar6;
  
  psVar4 = s->header;
  uVar5 = s->header_pos;
  uVar2 = psVar4->len;
  uVar6 = uVar5;
  if (uVar5 < uVar2) {
    do {
      uVar6 = uVar5;
      if ((0x20 < (ulong)(byte)psVar4->s[uVar5]) ||
         ((0x100000600U >> ((ulong)(byte)psVar4->s[uVar5] & 0x3f) & 1) == 0)) break;
      uVar5 = uVar5 + 1;
      uVar6 = uVar2;
    } while (uVar2 != uVar5);
  }
  if (uVar6 == uVar2) {
    _Var3 = false;
  }
  else {
    bVar1 = psVar4->s[uVar6];
    if ((((0x3b < bVar1 - 0x22) ||
         (_Var3 = false, (0xe0000007f0024c1U >> ((ulong)(bVar1 - 0x22) & 0x3f) & 1) == 0)) &&
        (_Var3 = false, bVar1 != 0x7b)) && (bVar1 != 0x7d)) {
      strbuf_shrink_to(s->token,0);
      psVar4 = s->header;
      if (uVar6 < psVar4->len) {
        do {
          bVar1 = psVar4->s[uVar6];
          if (((bVar1 - 9 < 0x38) && ((0xfe004982800003U >> ((ulong)(bVar1 - 9) & 0x3f) & 1) != 0))
             || ((bVar1 - 0x5b < 0x23 && ((0x500000007U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0)
                 ))) break;
          uVar6 = uVar6 + 1;
          BinarySink_put_byte(s->token->binarysink_,bVar1);
          psVar4 = s->header;
        } while (uVar6 < psVar4->len);
      }
      s->header_pos = uVar6;
      _Var3 = true;
    }
  }
  return _Var3;
}

Assistant:

static bool get_token(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (is_separator(s->header->s[pos]))
        return false;

    strbuf_clear(s->token);
    while (pos < s->header->len &&
           !is_whitespace(s->header->s[pos]) &&
           !is_separator(s->header->s[pos]))
        put_byte(s->token, s->header->s[pos++]);

    s->header_pos = pos;
    return true;
}